

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_read1_core(BGZF *fp,bcf1_t *v)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  uint32_t x [8];
  uint local_38;
  uint local_34;
  undefined8 local_30;
  undefined8 uStack_28;
  uint local_20;
  uint local_1c;
  
  sVar2 = bgzf_read(fp,&local_38,0x20);
  if ((int)sVar2 == 0) {
    iVar1 = -1;
  }
  else if ((int)sVar2 == 0x20) {
    bcf_clear(v);
    local_38 = local_38 - 0x18;
    if ((v->shared).m < (ulong)local_38) {
      uVar3 = (ulong)local_38 - 1;
      uVar3 = uVar3 >> 1 | uVar3;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      sVar5 = (uVar3 >> 0x10 | uVar3) + 1;
      (v->shared).m = sVar5;
      pcVar4 = (char *)realloc((v->shared).s,sVar5);
      if (pcVar4 != (char *)0x0) {
        (v->shared).s = pcVar4;
      }
    }
    if ((v->indiv).m < (ulong)local_34) {
      uVar3 = (ulong)local_34 - 1;
      uVar3 = uVar3 >> 1 | uVar3;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      sVar5 = (uVar3 >> 0x10 | uVar3) + 1;
      (v->indiv).m = sVar5;
      pcVar4 = (char *)realloc((v->indiv).s,sVar5);
      if (pcVar4 != (char *)0x0) {
        (v->indiv).s = pcVar4;
      }
    }
    v->rid = (undefined4)local_30;
    v->pos = local_30._4_4_;
    v->rlen = (undefined4)uStack_28;
    v->qual = (float)uStack_28._4_4_;
    *(ulong *)&v->field_0x10 =
         CONCAT44(*(undefined4 *)&v->field_0x14,local_20) & 0xffffffffffff0000 |
         (ulong)(local_20 & 0xffff);
    uVar3 = (ulong)local_1c << 0x28 | (ulong)local_20;
    *(ulong *)&v->field_0x10 = (ulong)(local_1c >> 0x18) << 0x20 | uVar3;
    (v->shared).l = (ulong)local_38;
    (v->indiv).l = (ulong)local_34;
    if (0xffffff < local_1c && ((local_1c & 0xffffff) == 0 || (ulong)local_34 == 0)) {
      *(ulong *)&v->field_0x10 = uVar3;
    }
    bgzf_read(fp,(v->shared).s,(ulong)local_38);
    bgzf_read(fp,(v->indiv).s,(v->indiv).l);
    iVar1 = 0;
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

static inline int bcf_read1_core(BGZF *fp, bcf1_t *v)
{
    uint32_t x[8];
    int ret;
    if ((ret = bgzf_read(fp, x, 32)) != 32) {
        if (ret == 0) return -1;
        return -2;
    }
    bcf_clear1(v);
    x[0] -= 24; // to exclude six 32-bit integers
    ks_resize(&v->shared, x[0]);
    ks_resize(&v->indiv, x[1]);
    memcpy(v, x + 2, 16);
    v->n_allele = x[6]>>16; v->n_info = x[6]&0xffff;
    v->n_fmt = x[7]>>24; v->n_sample = x[7]&0xffffff;
    v->shared.l = x[0], v->indiv.l = x[1];

    // silent fix of broken BCFs produced by earlier versions of bcf_subset, prior to and including bd6ed8b4
    if ( (!v->indiv.l || !v->n_sample) && v->n_fmt ) v->n_fmt = 0;

    bgzf_read(fp, v->shared.s, v->shared.l);
    bgzf_read(fp, v->indiv.s, v->indiv.l);
    return 0;
}